

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.cc
# Opt level: O2

void proto2_unittest::NestedTestMessageSetContainer::SharedDtor(MessageLite *self)

{
  TestMessageSetContainer *this;
  NestedTestMessageSetContainer *pNVar1;
  ulong uVar2;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    this = (TestMessageSetContainer *)self[1]._internal_metadata_.ptr_;
    if (this != (TestMessageSetContainer *)0x0) {
      TestMessageSetContainer::~TestMessageSetContainer(this);
    }
    operator_delete(this,0x20);
    pNVar1 = (NestedTestMessageSetContainer *)self[2]._vptr_MessageLite;
    if (pNVar1 != (NestedTestMessageSetContainer *)0x0) {
      ~NestedTestMessageSetContainer(pNVar1);
    }
    operator_delete(pNVar1,0x30);
    pNVar1 = (NestedTestMessageSetContainer *)self[2]._internal_metadata_.ptr_;
    if (pNVar1 != (NestedTestMessageSetContainer *)0x0) {
      ~NestedTestMessageSetContainer(pNVar1);
    }
    operator_delete(pNVar1,0x30);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_mset.pb.cc"
             ,0x2d8,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void NestedTestMessageSetContainer::SharedDtor(MessageLite& self) {
  NestedTestMessageSetContainer& this_ = static_cast<NestedTestMessageSetContainer&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.container_;
  delete this_._impl_.child_;
  delete this_._impl_.lazy_child_;
  this_._impl_.~Impl_();
}